

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

Mat3x3d * __thiscall OpenMD::RigidBody::calcForcesAndTorquesAndVirial(RigidBody *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  uint uVar6;
  Snapshot *pSVar7;
  size_type sVar8;
  reference ppAVar9;
  double *pdVar10;
  long in_RSI;
  RectMatrix<double,_3U,_3U> *in_RDI;
  uint i;
  int sl;
  Vector3d pos;
  int eCount;
  AtomType *atype;
  Vector3d ef;
  Vector3d trq;
  Vector3d frc;
  Vector3d dfrc;
  Vector3d rpos;
  Vector3d apos;
  Vector3d atrq;
  Vector3d afrc;
  Mat3x3d *tau_;
  Vector<double,_3U> *in_stack_fffffffffffffb78;
  AtomType *in_stack_fffffffffffffb80;
  StuntDouble *in_stack_fffffffffffffb88;
  StuntDouble *in_stack_fffffffffffffb90;
  uint local_170;
  double local_130;
  Vector<double,_3U> local_128 [2];
  double local_f8;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  double local_c0;
  Vector<double,_3U> local_b8 [3];
  Vector<double,_3U> local_70 [3];
  Vector<double,_3U> local_28;
  
  Vector3<double>::Vector3((Vector3<double> *)0x31cf57);
  Vector3<double>::Vector3((Vector3<double> *)0x31cf64);
  Vector3<double>::Vector3((Vector3<double> *)0x31cf71);
  Vector3<double>::Vector3((Vector3<double> *)0x31cf7e);
  Vector3<double>::Vector3((Vector3<double> *)0x31cf8b);
  local_c0 = 0.0;
  Vector<double,_3U>::Vector(local_b8,&local_c0);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  local_f8 = 0.0;
  Vector<double,_3U>::Vector(&local_f0,&local_f8);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  local_130 = 0.0;
  Vector<double,_3U>::Vector(local_128,&local_130);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  StuntDouble::getPos(in_stack_fffffffffffffb88);
  SquareMatrix3<double>::SquareMatrix3
            ((SquareMatrix3<double> *)in_stack_fffffffffffffb80,(double)in_stack_fffffffffffffb78);
  pSVar7 = SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RSI + 0x18));
  uVar6 = DataStorage::getStorageLayout
                    ((DataStorage *)
                     ((long)&(pSVar7->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + *(long *)(in_RSI + 0x10)));
  for (local_170 = 0;
      sVar8 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size
                        ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RSI + 0x128)
                        ), local_170 < sVar8; local_170 = local_170 + 1) {
    ppAVar9 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                        ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RSI + 0x128)
                         ,(ulong)local_170);
    Atom::getAtomType(*ppAVar9);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RSI + 0x128),
               (ulong)local_170);
    StuntDouble::getFrc(in_stack_fffffffffffffb88);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffb80,
               (Vector3<double> *)in_stack_fffffffffffffb78);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RSI + 0x128),
               (ulong)local_170);
    StuntDouble::getPos(in_stack_fffffffffffffb88);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffb80,
               (Vector3<double> *)in_stack_fffffffffffffb78);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb88,
                      (Vector<double,_3U> *)in_stack_fffffffffffffb80);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffb88,
               (Vector<double,_3U> *)in_stack_fffffffffffffb80);
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    pdVar10 = Vector<double,_3U>::operator[](local_70,1);
    dVar1 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_28,2);
    dVar2 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](local_70,2);
    dVar3 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_28,1);
    dVar4 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_d8,0);
    *pdVar10 = *pdVar10 + (dVar1 * dVar2 - dVar3 * dVar4);
    pdVar10 = Vector<double,_3U>::operator[](local_70,2);
    dVar1 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_28,0);
    dVar2 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](local_70,0);
    dVar3 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_28,2);
    dVar4 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_d8,1);
    *pdVar10 = *pdVar10 + (dVar1 * dVar2 - dVar3 * dVar4);
    pdVar10 = Vector<double,_3U>::operator[](local_70,0);
    dVar1 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_28,1);
    dVar2 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](local_70,1);
    dVar3 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_28,0);
    dVar4 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_d8,2);
    *pdVar10 = *pdVar10 + (dVar1 * dVar2 - dVar3 * dVar4);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RSI + 0x128),
               (ulong)local_170);
    bVar5 = Atom::isDirectional((Atom *)0x31d5a7);
    if (bVar5) {
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RSI + 0x128),
                 (ulong)local_170);
      StuntDouble::getTrq(in_stack_fffffffffffffb88);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffb80,
                 (Vector3<double> *)in_stack_fffffffffffffb78);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    }
    if (((uVar6 & 0x1000) != 0) &&
       (bVar5 = AtomType::isElectrostatic(in_stack_fffffffffffffb80), bVar5)) {
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RSI + 0x128),
                 (ulong)local_170);
      StuntDouble::getElectricField(in_stack_fffffffffffffb88);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    }
    pdVar10 = Vector<double,_3U>::operator[](local_70,0);
    dVar1 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_28,0);
    dVar2 = *pdVar10;
    pdVar10 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,0,0);
    *pdVar10 = *pdVar10 - dVar1 * dVar2;
    pdVar10 = Vector<double,_3U>::operator[](local_70,0);
    dVar1 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_28,1);
    dVar2 = *pdVar10;
    pdVar10 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,0,1);
    *pdVar10 = *pdVar10 - dVar1 * dVar2;
    pdVar10 = Vector<double,_3U>::operator[](local_70,0);
    dVar1 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_28,2);
    dVar2 = *pdVar10;
    pdVar10 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,0,2);
    *pdVar10 = *pdVar10 - dVar1 * dVar2;
    pdVar10 = Vector<double,_3U>::operator[](local_70,1);
    dVar1 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_28,0);
    dVar2 = *pdVar10;
    pdVar10 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,1,0);
    *pdVar10 = *pdVar10 - dVar1 * dVar2;
    pdVar10 = Vector<double,_3U>::operator[](local_70,1);
    dVar1 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_28,1);
    dVar2 = *pdVar10;
    pdVar10 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,1,1);
    *pdVar10 = *pdVar10 - dVar1 * dVar2;
    pdVar10 = Vector<double,_3U>::operator[](local_70,1);
    dVar1 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_28,2);
    dVar2 = *pdVar10;
    pdVar10 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,1,2);
    *pdVar10 = *pdVar10 - dVar1 * dVar2;
    pdVar10 = Vector<double,_3U>::operator[](local_70,2);
    dVar1 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_28,0);
    dVar2 = *pdVar10;
    pdVar10 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,2,0);
    *pdVar10 = *pdVar10 - dVar1 * dVar2;
    pdVar10 = Vector<double,_3U>::operator[](local_70,2);
    dVar1 = *pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_28,1);
    dVar2 = *pdVar10;
    pdVar10 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,2,1);
    *pdVar10 = *pdVar10 - dVar1 * dVar2;
    pdVar10 = Vector<double,_3U>::operator[](local_70,2);
    in_stack_fffffffffffffb90 = (StuntDouble *)*pdVar10;
    pdVar10 = Vector<double,_3U>::operator[](&local_28,2);
    in_stack_fffffffffffffb80 = (AtomType *)*pdVar10;
    in_stack_fffffffffffffb88 = (StuntDouble *)RectMatrix<double,_3U,_3U>::operator()(in_RDI,2,2);
    in_stack_fffffffffffffb88->_vptr_StuntDouble =
         (_func_int **)
         (-(double)in_stack_fffffffffffffb90 * (double)in_stack_fffffffffffffb80 +
         (double)in_stack_fffffffffffffb88->_vptr_StuntDouble);
  }
  StuntDouble::addFrc(in_stack_fffffffffffffb90,(Vector3d *)in_stack_fffffffffffffb88);
  StuntDouble::addTrq(in_stack_fffffffffffffb90,(Vector3d *)in_stack_fffffffffffffb88);
  if ((uVar6 & 0x1000) != 0) {
    Vector<double,_3U>::operator/=
              ((Vector<double,_3U> *)in_stack_fffffffffffffb80,(double)in_stack_fffffffffffffb78);
    StuntDouble::setElectricField(in_stack_fffffffffffffb90,(Vector3d *)in_stack_fffffffffffffb88);
  }
  return (Mat3x3d *)in_RDI;
}

Assistant:

Mat3x3d RigidBody::calcForcesAndTorquesAndVirial() {
    Vector3d afrc;
    Vector3d atrq;
    Vector3d apos;
    Vector3d rpos;
    Vector3d dfrc;
    Vector3d frc(0.0);
    Vector3d trq(0.0);
    Vector3d ef(0.0);
    AtomType* atype;
    int eCount = 0;

    Vector3d pos = this->getPos();
    Mat3x3d tau_(0.0);

    int sl =
        ((snapshotMan_->getCurrentSnapshot())->*storage_).getStorageLayout();

    for (unsigned int i = 0; i < atoms_.size(); i++) {
      atype = atoms_[i]->getAtomType();

      afrc = atoms_[i]->getFrc();
      apos = atoms_[i]->getPos();
      rpos = apos - pos;

      frc += afrc;

      trq[0] += rpos[1] * afrc[2] - rpos[2] * afrc[1];
      trq[1] += rpos[2] * afrc[0] - rpos[0] * afrc[2];
      trq[2] += rpos[0] * afrc[1] - rpos[1] * afrc[0];

      // If the atom has a torque associated with it, then we also need to
      // migrate the torques onto the center of mass:

      if (atoms_[i]->isDirectional()) {
        atrq = atoms_[i]->getTrq();
        trq += atrq;
      }

      if ((sl & DataStorage::dslElectricField) && (atype->isElectrostatic())) {
        ef += atoms_[i]->getElectricField();
        eCount++;
      }

      tau_(0, 0) -= rpos[0] * afrc[0];
      tau_(0, 1) -= rpos[0] * afrc[1];
      tau_(0, 2) -= rpos[0] * afrc[2];
      tau_(1, 0) -= rpos[1] * afrc[0];
      tau_(1, 1) -= rpos[1] * afrc[1];
      tau_(1, 2) -= rpos[1] * afrc[2];
      tau_(2, 0) -= rpos[2] * afrc[0];
      tau_(2, 1) -= rpos[2] * afrc[1];
      tau_(2, 2) -= rpos[2] * afrc[2];
    }
    addFrc(frc);
    addTrq(trq);

    if (sl & DataStorage::dslElectricField) {
      ef /= eCount;
      setElectricField(ef);
    }

    return tau_;
  }